

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

pointer __thiscall QList<void_(*)(void_*)>::data(QList<void_(*)(void_*)> *this)

{
  QArrayDataPointer<void_(*)(void_*)> *this_00;
  _func_void_void_ptr **pp_Var1;
  QArrayDataPointer<void_(*)(void_*)> *in_RDI;
  
  detach((QList<void_(*)(void_*)> *)0x6d913c);
  this_00 = (QArrayDataPointer<void_(*)(void_*)> *)
            QArrayDataPointer<void_(*)(void_*)>::operator->(in_RDI);
  pp_Var1 = QArrayDataPointer<void_(*)(void_*)>::data(this_00);
  return pp_Var1;
}

Assistant:

pointer data() { detach(); return d->data(); }